

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PlotFileUtil.cpp
# Opt level: O2

void amrex::EB_WriteMultiLevelPlotfile
               (string *plotfilename,int nlevels,
               Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *mf,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *varnames,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *geom,Real time,
               Vector<int,_std::allocator<int>_> *level_steps,
               Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *ref_ratio,
               string *versionName,string *levelPrefix,string *mfPrefix,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *extra_dirs)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  EBFArrayBoxFactory *this;
  MultiFab *pMVar4;
  int level;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  undefined4 in_register_00000034;
  char *pcVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  uint uVar10;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  allocator local_2f1;
  ulong local_2f0;
  string *local_2e8;
  string HeaderFileName;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> boxArrays;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vn;
  IO_Buffer io_buffer;
  string ed;
  int aiStack_210 [120];
  
  pcVar8 = (char *)CONCAT44(in_register_00000034,nlevels);
  local_2e8 = plotfilename;
  bVar3 = FabArray<amrex::FArrayBox>::hasEBFabFactory
                    (&(*(mf->
                        super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                        ).
                        super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                        ._M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>
                    );
  if (!bVar3) {
    pcVar8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_PlotFileUtil.cpp"
    ;
    Assert_host("mf[0]->hasEBFabFactory()",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_PlotFileUtil.cpp"
                ,0x18b,"\"EB_WriteMultiLevelPlotfile: does not have EB Factory\"");
  }
  local_2f0 = CONCAT44(local_2f0._4_4_,nlevels);
  PreBuildDirectorHierarchy(local_2e8,(string *)pcVar8,nlevels,false);
  __rhs = (extra_dirs->
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (extra_dirs->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__rhs != pbVar2) {
    for (; __rhs != pbVar2; __rhs = __rhs + 1) {
      std::operator+(&HeaderFileName,local_2e8,"/");
      pbVar9 = &HeaderFileName;
      std::operator+(&ed,&HeaderFileName,__rhs);
      std::__cxx11::string::~string((string *)&HeaderFileName);
      PreBuildDirectorHierarchy(&ed,pbVar9,(uint)local_2f0,false);
      std::__cxx11::string::~string((string *)&ed);
    }
  }
  ParallelDescriptor::Barrier((string *)ParallelDescriptor::Unnamed_abi_cxx11_);
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    std::vector<char,_std::allocator<char>_>::vector
              (&io_buffer.super_vector<char,_std::allocator<char>_>,0x200000,(allocator_type *)&ed);
    iVar1 = (uint)local_2f0;
    std::operator+(&HeaderFileName,local_2e8,"/Header");
    std::ofstream::ofstream(&ed);
    (**(code **)(ed._M_string_length + 0x18))
              (&ed._M_string_length,
               io_buffer.super_vector<char,_std::allocator<char>_>.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start,(long)io_buffer.super_vector<char,_std::allocator<char>_>.
                              super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)io_buffer.super_vector<char,_std::allocator<char>_>.
                              super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
    std::ofstream::open((char *)&ed,(_Ios_Openmode)HeaderFileName._M_dataplus._M_p);
    if (*(int *)((long)aiStack_210 + *(long *)(ed._M_dataplus._M_p + -0x18)) != 0) {
      FileOpenFailed(&HeaderFileName);
    }
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              (&boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
               (long)iVar1,(allocator_type *)&local_280);
    lVar11 = 0;
    for (lVar6 = 0;
        lVar6 < ((long)boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                (long)boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x68; lVar6 = lVar6 + 1) {
      BoxArray::operator=((BoxArray *)
                          ((long)&((boxArrays.
                                    super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                                    super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                          lVar11),(BoxArray *)
                                  ((long)&((mf->
                                           super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                                           ).
                                           super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar6]->
                                          super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))
      ;
      lVar11 = lVar11 + 0x68;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&vn.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ,&varnames->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
    std::__cxx11::string::string((string *)&local_280,"vfrac",&local_2f1);
    uVar5 = (uint)local_2f0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vn,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    WriteGenericPlotfileHeader
              ((ostream *)&ed,uVar5,&boxArrays,&vn,geom,time,level_steps,ref_ratio,versionName,
               levelPrefix,mfPrefix);
    uVar10 = 0;
    if (0 < (int)uVar5) {
      uVar10 = uVar5;
    }
    uVar5 = uVar10;
    while (bVar3 = uVar5 != 0, uVar5 = uVar5 - 1, bVar3) {
      std::operator<<((ostream *)&ed,"1.0e-6\n");
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vn.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector
              (&boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>);
    std::ofstream::~ofstream(&ed);
    std::__cxx11::string::~string((string *)&HeaderFileName);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&io_buffer);
  }
  else {
    uVar10 = 0;
    if (0 < (int)(uint)local_2f0) {
      uVar10 = (uint)local_2f0;
    }
  }
  local_2f0 = (ulong)uVar10;
  uVar7 = 0;
  while( true ) {
    if (local_2f0 == uVar7) {
      return;
    }
    pMVar4 = (mf->super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
             super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar7];
    iVar1 = *(int *)((long)&(pMVar4->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 0xcc);
    HeaderFileName._M_dataplus._M_p = (pointer)0x1;
    HeaderFileName.field_2._8_8_ = 0;
    HeaderFileName._M_string_length = 0;
    HeaderFileName.field_2._M_allocated_capacity = 0;
    local_280._M_dataplus._M_p = (pointer)&PTR__FabFactory_006d8928;
    MultiFab::MultiFab((MultiFab *)&ed,
                       (BoxArray *)
                       ((long)&(pMVar4->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8),
                       (DistributionMapping *)
                       ((long)&(pMVar4->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 0x70)
                       ,iVar1 + 1,0,(MFInfo *)&HeaderFileName,
                       (FabFactory<amrex::FArrayBox> *)&local_280);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&HeaderFileName.field_2);
    MultiFab::Copy((MultiFab *)&ed,
                   (mf->
                   super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                   super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar7],0,0,iVar1,0);
    this = (EBFArrayBoxFactory *)
           __dynamic_cast((tuple<amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           )((mf->
                             super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                             ).
                             super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar7]->
                            super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                            super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          ,&FabFactory<amrex::FArrayBox>::typeinfo,&EBFArrayBoxFactory::typeinfo,0);
    if (this == (EBFArrayBoxFactory *)0x0) break;
    pMVar4 = EBFArrayBoxFactory::getVolFrac(this);
    MultiFab::Copy((MultiFab *)&ed,pMVar4,0,iVar1,1,0);
    MultiFabFileFullPrefix(&HeaderFileName,(int)uVar7,local_2e8,levelPrefix,mfPrefix);
    VisMF::Write((FabArray<amrex::FArrayBox> *)&ed,&HeaderFileName,NFiles,false);
    std::__cxx11::string::~string((string *)&HeaderFileName);
    MultiFab::~MultiFab((MultiFab *)&ed);
    uVar7 = uVar7 + 1;
  }
  __cxa_bad_cast();
}

Assistant:

void
EB_WriteMultiLevelPlotfile (const std::string& plotfilename, int nlevels,
                            const Vector<const MultiFab*>& mf,
                            const Vector<std::string>& varnames,
                            const Vector<Geometry>& geom, Real time, const Vector<int>& level_steps,
                            const Vector<IntVect>& ref_ratio,
                            const std::string &versionName,
                            const std::string &levelPrefix,
                            const std::string &mfPrefix,
                            const Vector<std::string>& extra_dirs)
{
    BL_PROFILE("WriteMultiLevelPlotfile()");

    BL_ASSERT(nlevels <= mf.size());
    BL_ASSERT(nlevels <= geom.size());
    BL_ASSERT(nlevels <= ref_ratio.size()+1);
    BL_ASSERT(nlevels <= level_steps.size());
    BL_ASSERT(mf[0]->nComp() == varnames.size());
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(mf[0]->hasEBFabFactory(),
                                     "EB_WriteMultiLevelPlotfile: does not have EB Factory");

    int finest_level = nlevels-1;

//    int saveNFiles(VisMF::GetNOutFiles());
//    VisMF::SetNOutFiles(std::max(1024,saveNFiles));

    bool callBarrier(false);
    PreBuildDirectorHierarchy(plotfilename, levelPrefix, nlevels, callBarrier);
    if (!extra_dirs.empty()) {
        for (const auto& d : extra_dirs) {
            const std::string ed = plotfilename+"/"+d;
            amrex::PreBuildDirectorHierarchy(ed, levelPrefix, nlevels, callBarrier);
        }
    }
    ParallelDescriptor::Barrier();

    if (ParallelDescriptor::IOProcessor()) {
        VisMF::IO_Buffer io_buffer(VisMF::IO_Buffer_Size);
        std::string HeaderFileName(plotfilename + "/Header");
        std::ofstream HeaderFile;
        HeaderFile.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());
        HeaderFile.open(HeaderFileName.c_str(), std::ofstream::out   |
                                                std::ofstream::trunc |
                                                std::ofstream::binary);
        if( ! HeaderFile.good()) {
            FileOpenFailed(HeaderFileName);
        }

        Vector<BoxArray> boxArrays(nlevels);
        for(int level(0); level < boxArrays.size(); ++level) {
            boxArrays[level] = mf[level]->boxArray();
        }

        Vector<std::string> vn = varnames;
        vn.push_back("vfrac");
        WriteGenericPlotfileHeader(HeaderFile, nlevels, boxArrays, vn,
                                   geom, time, level_steps, ref_ratio, versionName,
                                   levelPrefix, mfPrefix);

        for (int lev = 0; lev < nlevels; ++lev) {
            HeaderFile << "1.0e-6\n";
        }
    }


    for (int level = 0; level <= finest_level; ++level)
    {
        const int nc = mf[level]->nComp();
        MultiFab mf_tmp(mf[level]->boxArray(),
                        mf[level]->DistributionMap(),
                        nc+1, 0);
        MultiFab::Copy(mf_tmp, *mf[level], 0, 0, nc, 0);
        auto const& factory = dynamic_cast<EBFArrayBoxFactory const&>(mf[level]->Factory());
        MultiFab::Copy(mf_tmp, factory.getVolFrac(), 0, nc, 1, 0);
        VisMF::Write(mf_tmp, MultiFabFileFullPrefix(level, plotfilename, levelPrefix, mfPrefix));
    }

//    VisMF::SetNOutFiles(saveNFiles);
}